

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Transform *world_T_base,VectorDynSize *s,Twist *base_velocity,
          VectorDynSize *s_dot,Vector3 *world_gravity)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  VectorDynSize *vec;
  VectorDynSize *pVVar2;
  long lVar3;
  long lVar4;
  Transform *this_00;
  Twist *pTVar5;
  Twist *in_RCX;
  Transform *in_RSI;
  KinDynComputations *in_RDI;
  double *in_R9;
  Rotation base_R_inertial;
  bool ok;
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffd98;
  Twist local_240 [96];
  Transform local_1e0 [48];
  Twist local_1b0 [72];
  Rotation local_168 [303];
  undefined1 local_39;
  double *local_38;
  Twist *local_28;
  Transform *local_18;
  bool local_1;
  
  local_38 = in_R9;
  local_28 = in_RCX;
  local_18 = in_RSI;
  vec = (VectorDynSize *)iDynTree::VectorDynSize::size();
  pVVar2 = (VectorDynSize *)iDynTree::Model::getNrOfPosCoords();
  local_39 = vec == pVVar2;
  if ((bool)local_39) {
    lVar3 = iDynTree::VectorDynSize::size();
    lVar4 = iDynTree::Model::getNrOfDOFs();
    local_39 = lVar3 == lVar4;
    if ((bool)local_39) {
      invalidateCache(in_RDI);
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::operator=(this_00,local_18);
      toEigen(vec);
      iDynTree::FreeFloatingPos::jointPos();
      toEigen(vec);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_18,
                 in_stack_fffffffffffffd98);
      pKVar1 = in_RDI->pimpl;
      (pKVar1->m_gravityAcc).m_data[0] = *local_38;
      (pKVar1->m_gravityAcc).m_data[1] = local_38[1];
      (pKVar1->m_gravityAcc).m_data[2] = local_38[2];
      iDynTree::FreeFloatingPos::worldBasePos();
      iDynTree::Transform::getRotation();
      iDynTree::Rotation::inverse();
      toEigen<3u,3u>((MatrixFixSize<3U,_3U> *)vec);
      toEigen<3U>((VectorFixSize<3U> *)vec);
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>,0,Eigen::Stride<0,0>>>::operator*
                ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>_>
                  *)vec,(MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)in_RDI);
      toEigen<3U>((VectorFixSize<3U> *)vec);
      Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)local_18,
                 (DenseBase<Eigen::Product<Eigen::Map<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
                  *)in_stack_fffffffffffffd98);
      toEigen(vec);
      iDynTree::FreeFloatingVel::jointVel();
      toEigen(vec);
      Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>::operator=
                ((Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)local_18,
                 in_stack_fffffffffffffd98);
      iDynTree::Twist::operator=(&in_RDI->pimpl->m_baseVelSetViaRobotState,local_28);
      if (in_RDI->pimpl->m_frameVelRepr == MIXED_REPRESENTATION) {
        iDynTree::FreeFloatingPos::worldBasePos();
        iDynTree::Transform::getRotation();
        iDynTree::Rotation::inverse();
        iDynTree::Rotation::operator*(local_168,local_1b0);
        pTVar5 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
        iDynTree::Twist::operator=(pTVar5,(Twist *)local_168);
      }
      else if (in_RDI->pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION) {
        pTVar5 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
        iDynTree::Twist::operator=(pTVar5,local_28);
      }
      else {
        iDynTree::FreeFloatingPos::worldBasePos();
        iDynTree::Transform::inverse();
        iDynTree::Transform::operator*(local_1e0,local_240);
        pTVar5 = (Twist *)iDynTree::FreeFloatingVel::baseVel();
        iDynTree::Twist::operator=(pTVar5,(Twist *)local_1e0);
      }
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("KinDynComputations","setRobotState","Wrong size in input joint velocities");
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","setRobotState","Wrong size in input joint positions");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KinDynComputations::setRobotState(const Transform& world_T_base,
                                       const VectorDynSize& s,
                                       const Twist& base_velocity,
                                       const VectorDynSize& s_dot,
                                       const Vector3& world_gravity)
{

    bool ok = s.size() == pimpl->m_robot_model.getNrOfPosCoords();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint positions");
        return false;
    }

    ok = s_dot.size() == pimpl->m_robot_model.getNrOfDOFs();
    if( !ok )
    {
        reportError("KinDynComputations","setRobotState","Wrong size in input joint velocities");
        return false;
    }

    this->invalidateCache();

    // Save pos
    this->pimpl->m_pos.worldBasePos() = world_T_base;
    toEigen(this->pimpl->m_pos.jointPos()) = toEigen(s);

    // Save gravity
    this->pimpl->m_gravityAcc = world_gravity;
    Rotation base_R_inertial = this->pimpl->m_pos.worldBasePos().getRotation().inverse();
    toEigen(pimpl->m_gravityAccInBaseLinkFrame) = toEigen(base_R_inertial)*toEigen(this->pimpl->m_gravityAcc);

    // Save vel
    toEigen(pimpl->m_vel.jointVel()) = toEigen(s_dot);
    this->pimpl->m_baseVelSetViaRobotState = base_velocity;

    // Account for the different possible representations
    if (pimpl->m_frameVelRepr == MIXED_REPRESENTATION)
    {
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().getRotation().inverse()*base_velocity;
    }
    else if (pimpl->m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        // Data is stored in body fixed
        pimpl->m_vel.baseVel() = base_velocity;
    }
    else
    {
        assert(pimpl->m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        // base_X_inertial \ls^inertial v_base
        pimpl->m_vel.baseVel() = pimpl->m_pos.worldBasePos().inverse()*base_velocity;
    }

    return true;
}